

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

int secp256k1_ecmult_pippenger_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  secp256k1_scalar *r2;
  long lVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_EAX;
  long lVar9;
  secp256k1_ge *a;
  secp256k1_scalar *r1;
  long *plVar10;
  void *pvVar11;
  ulong uVar12;
  secp256k1_gej *r_00;
  secp256k1_gej *psVar13;
  secp256k1_scalar *psVar14;
  secp256k1_ge *psVar15;
  long lVar16;
  secp256k1_ge *psVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  size_t checkpoint;
  long lVar21;
  ulong uVar22;
  byte bVar23;
  undefined1 auVar24 [16];
  secp256k1_scalar tmp;
  long local_148;
  long local_138;
  long local_128;
  secp256k1_gej local_c8;
  
  bVar23 = 0;
  lVar9 = 0;
  do {
    if (scratch->magic[lVar9] != "scratch"[lVar9]) {
      (*error_callback->fn)("invalid scratch space",error_callback->data);
      checkpoint = 0;
      goto LAB_0014ffff;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  checkpoint = scratch->alloc_size;
LAB_0014ffff:
  secp256k1_gej_set_infinity(r);
  iVar8 = 1;
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n_points != 0) {
    lVar9 = n_points * 2 + 2;
    uVar7 = secp256k1_pippenger_bucket_window(n_points);
    a = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback,scratch,lVar9 * 0x68);
    r1 = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback,scratch,lVar9 * 0x20);
    plVar10 = (long *)secp256k1_scratch_alloc(error_callback,scratch,0x10);
    if ((plVar10 != (long *)0x0 && r1 != (secp256k1_scalar *)0x0) && a != (secp256k1_ge *)0x0) {
      pvVar11 = secp256k1_scratch_alloc(error_callback,scratch,lVar9 * 0x10);
      plVar10[1] = (long)pvVar11;
      uVar12 = (ulong)(byte)(0x7f / (byte)(uVar7 + 1) + 1);
      pvVar11 = secp256k1_scratch_alloc(error_callback,scratch,lVar9 * uVar12 * 4);
      *plVar10 = (long)pvVar11;
      r_00 = (secp256k1_gej *)
             secp256k1_scratch_alloc(error_callback,scratch,0x98L << ((byte)uVar7 & 0x3f));
      if ((plVar10[1] != 0) && (r_00 != (secp256k1_gej *)0x0 && *plVar10 != 0)) {
        if (inp_g_sc == (secp256k1_scalar *)0x0) {
          local_128 = 0;
        }
        else {
          uVar4 = inp_g_sc->d[0];
          uVar5 = inp_g_sc->d[1];
          uVar6 = inp_g_sc->d[3];
          r1->d[2] = inp_g_sc->d[2];
          r1->d[3] = uVar6;
          r1->d[0] = uVar4;
          r1->d[1] = uVar5;
          psVar15 = &secp256k1_ge_const_g;
          psVar17 = a;
          for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
            (psVar17->x).n[0] = (psVar15->x).n[0];
            psVar15 = (secp256k1_ge *)((long)psVar15 + ((ulong)bVar23 * -2 + 1) * 8);
            psVar17 = (secp256k1_ge *)((long)psVar17 + (ulong)bVar23 * -0x10 + 8);
          }
          psVar14 = r1 + 1;
          psVar15 = a + 1;
          local_c8.x.n[0] = r1->d[0];
          local_c8.x.n[1] = r1->d[1];
          local_c8.x.n[2] = r1->d[2];
          local_c8.x.n[3] = r1->d[3];
          secp256k1_scalar_split_lambda(r1,psVar14,(secp256k1_scalar *)&local_c8);
          secp256k1_ge_mul_lambda(psVar15,a);
          iVar8 = secp256k1_scalar_is_high(r1);
          if (iVar8 != 0) {
            secp256k1_scalar_negate(r1,r1);
            secp256k1_ge_neg(a,a);
          }
          iVar8 = secp256k1_scalar_is_high(psVar14);
          if (iVar8 != 0) {
            secp256k1_scalar_negate(psVar14,psVar14);
            secp256k1_ge_neg(psVar15,psVar15);
          }
          local_128 = 2;
        }
        if (n_points != 0) {
          psVar14 = (secp256k1_scalar *)((long)r1->d + (ulong)(uint)((int)local_128 << 5));
          psVar15 = a + local_128;
          do {
            iVar8 = (*cb)(psVar14,psVar15,cb_offset,cbdata);
            if (iVar8 == 0) goto LAB_00150122;
            r2 = psVar14 + 1;
            psVar17 = psVar15 + 1;
            local_c8.x.n[0] = psVar14->d[0];
            local_c8.x.n[1] = psVar14->d[1];
            local_c8.x.n[2] = psVar14->d[2];
            local_c8.x.n[3] = psVar14->d[3];
            secp256k1_scalar_split_lambda(psVar14,r2,(secp256k1_scalar *)&local_c8);
            secp256k1_ge_mul_lambda(psVar17,psVar15);
            iVar8 = secp256k1_scalar_is_high(psVar14);
            if (iVar8 != 0) {
              secp256k1_scalar_negate(psVar14,psVar14);
              secp256k1_ge_neg(psVar15,psVar15);
            }
            iVar8 = secp256k1_scalar_is_high(r2);
            if (iVar8 != 0) {
              secp256k1_scalar_negate(r2,r2);
              secp256k1_ge_neg(psVar17,psVar17);
            }
            local_128 = local_128 + 2;
            cb_offset = cb_offset + 1;
            psVar14 = psVar14 + 2;
            psVar15 = psVar15 + 2;
            n_points = n_points - 1;
          } while (n_points != 0);
        }
        if (local_128 == 0) {
          secp256k1_gej_set_infinity(r);
        }
        else {
          lVar9 = 0;
          local_148 = 0;
          psVar15 = a;
          do {
            secp256k1_scalar_verify(r1);
            auVar24._0_4_ = -(uint)((int)r1->d[2] == 0 && (int)r1->d[0] == 0);
            auVar24._4_4_ =
                 -(uint)(*(int *)((long)r1->d + 0x14) == 0 && *(int *)((long)r1->d + 4) == 0);
            auVar24._8_4_ = -(uint)((int)r1->d[3] == 0 && (int)r1->d[1] == 0);
            auVar24._12_4_ =
                 -(uint)(*(int *)((long)r1->d + 0x1c) == 0 && *(int *)((long)r1->d + 0xc) == 0);
            iVar8 = movmskps(extraout_EAX,auVar24);
            if ((iVar8 != 0xf) && (secp256k1_ge_verify(psVar15), psVar15->infinity == 0)) {
              *(long *)(plVar10[1] + 8 + local_148 * 0x10) = lVar9;
              iVar8 = secp256k1_wnaf_fixed((int *)(local_148 * uVar12 * 4 + *plVar10),r1,uVar7 + 1);
              *(int *)(plVar10[1] + local_148 * 0x10) = iVar8;
              local_148 = local_148 + 1;
            }
            lVar9 = lVar9 + 1;
            psVar15 = psVar15 + 1;
            r1 = r1 + 1;
          } while (local_128 != lVar9);
          secp256k1_gej_set_infinity(r);
          if (local_148 != 0) {
            lVar16 = 1L << ((byte)uVar7 & 0x3f);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = (ulong)uVar7 + 1;
            auVar3 = (ZEXT816(0) << 0x40 | ZEXT816(0x7f)) / auVar3;
            uVar22 = (ulong)(uint)(auVar3._0_4_ << 2);
            lVar9 = uVar22 + 4;
            uVar12 = (ulong)((int)lVar16 - 2);
            psVar13 = r_00;
            lVar21 = lVar16;
            local_138 = auVar3._0_8_;
            do {
              do {
                secp256k1_gej_set_infinity(psVar13);
                lVar21 = lVar21 + -1;
                psVar13 = psVar13 + 1;
              } while (lVar21 != 0);
              lVar18 = 8;
              lVar21 = local_148;
              uVar19 = uVar22;
              do {
                uVar20 = *(uint *)(*plVar10 + uVar19);
                lVar1 = *(long *)(plVar10[1] + lVar18);
                if ((local_138 == 0) && (*(int *)(plVar10[1] + -8 + lVar18) != 0)) {
                  secp256k1_ge_neg((secp256k1_ge *)&local_c8,a + lVar1);
                  secp256k1_gej_add_ge_var(r_00,r_00,(secp256k1_ge *)&local_c8,(secp256k1_fe *)0x0);
                }
                if ((int)uVar20 < 1) {
                  if ((int)uVar20 < 0) {
                    uVar20 = ~uVar20;
                    secp256k1_ge_neg((secp256k1_ge *)&local_c8,a + lVar1);
                    psVar13 = &local_c8;
                    goto LAB_00150505;
                  }
                }
                else {
                  uVar20 = uVar20 - 1;
                  psVar13 = (secp256k1_gej *)(a + lVar1);
LAB_00150505:
                  secp256k1_gej_add_ge_var
                            (r_00 + (uVar20 >> 1),r_00 + (uVar20 >> 1),(secp256k1_ge *)psVar13,
                             (secp256k1_fe *)0x0);
                }
                lVar18 = lVar18 + 0x10;
                uVar19 = uVar19 + lVar9;
                lVar21 = lVar21 + -1;
                uVar20 = uVar7;
              } while (lVar21 != 0);
              do {
                secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
                uVar20 = uVar20 - 1;
              } while (uVar20 != 0);
              secp256k1_gej_set_infinity(&local_c8);
              psVar13 = r_00 + uVar12 + 1;
              lVar21 = uVar12 + 2;
              do {
                secp256k1_gej_add_var(&local_c8,&local_c8,psVar13,(secp256k1_fe *)0x0);
                secp256k1_gej_add_var(r,r,&local_c8,(secp256k1_fe *)0x0);
                lVar21 = lVar21 + -1;
                psVar13 = psVar13 + -1;
              } while (1 < lVar21);
              secp256k1_gej_add_var(&local_c8,&local_c8,r_00,(secp256k1_fe *)0x0);
              secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
              secp256k1_gej_add_var(r,r,&local_c8,(secp256k1_fe *)0x0);
              uVar22 = uVar22 - 4;
              bVar2 = 0 < local_138;
              psVar13 = r_00;
              lVar21 = lVar16;
              local_138 = local_138 + -1;
            } while (bVar2);
          }
        }
        secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
        return 1;
      }
    }
LAB_00150122:
    secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int secp256k1_ecmult_pippenger_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);
    /* Use 2(n+1) with the endomorphism, when calculating batch
     * sizes. The reason for +1 is that we add the G scalar to the list of
     * other scalars. */
    size_t entries = 2*n_points + 2;
    secp256k1_ge *points;
    secp256k1_scalar *scalars;
    secp256k1_gej *buckets;
    struct secp256k1_pippenger_state *state_space;
    size_t idx = 0;
    size_t point_idx = 0;
    int bucket_window;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }
    bucket_window = secp256k1_pippenger_bucket_window(n_points);

    /* We allocate PIPPENGER_SCRATCH_OBJECTS objects on the scratch space. If
     * these allocations change, make sure to update the
     * PIPPENGER_SCRATCH_OBJECTS constant and pippenger_scratch_size
     * accordingly. */
    points = (secp256k1_ge *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*points));
    scalars = (secp256k1_scalar *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*scalars));
    state_space = (struct secp256k1_pippenger_state *) secp256k1_scratch_alloc(error_callback, scratch, sizeof(*state_space));
    if (points == NULL || scalars == NULL || state_space == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }
    state_space->ps = (struct secp256k1_pippenger_point_state *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*state_space->ps));
    state_space->wnaf_na = (int *) secp256k1_scratch_alloc(error_callback, scratch, entries*(WNAF_SIZE(bucket_window+1)) * sizeof(int));
    buckets = (secp256k1_gej *) secp256k1_scratch_alloc(error_callback, scratch, ((size_t)1 << bucket_window) * sizeof(*buckets));
    if (state_space->ps == NULL || state_space->wnaf_na == NULL || buckets == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    if (inp_g_sc != NULL) {
        scalars[0] = *inp_g_sc;
        points[0] = secp256k1_ge_const_g;
        idx++;
        secp256k1_ecmult_endo_split(&scalars[0], &scalars[1], &points[0], &points[1]);
        idx++;
    }

    while (point_idx < n_points) {
        if (!cb(&scalars[idx], &points[idx], point_idx + cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        idx++;
        secp256k1_ecmult_endo_split(&scalars[idx - 1], &scalars[idx], &points[idx - 1], &points[idx]);
        idx++;
        point_idx++;
    }

    secp256k1_ecmult_pippenger_wnaf(buckets, bucket_window, state_space, r, scalars, points, idx);
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}